

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::TreeEnsembleRegressor
          (TreeEnsembleRegressor *this,TreeEnsembleRegressor *from)

{
  void *pvVar1;
  TreeEnsembleParameters *from_00;
  TreeEnsembleParameters *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleRegressor_0072c718;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->treeensemble_;
  if (from_00 == (TreeEnsembleParameters *)0x0 ||
      from == (TreeEnsembleRegressor *)&_TreeEnsembleRegressor_default_instance_) {
    this_00 = (TreeEnsembleParameters *)0x0;
  }
  else {
    this_00 = (TreeEnsembleParameters *)operator_new(0x50);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00,from_00);
  }
  this->treeensemble_ = this_00;
  this->postevaluationtransform_ = from->postevaluationtransform_;
  return;
}

Assistant:

TreeEnsembleRegressor::TreeEnsembleRegressor(const TreeEnsembleRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_treeensemble()) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters(*from.treeensemble_);
  } else {
    treeensemble_ = NULL;
  }
  postevaluationtransform_ = from.postevaluationtransform_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleRegressor)
}